

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O0

void handle_connection_error(int error)

{
  char *local_18;
  char *message;
  int error_local;
  
  switch(error) {
  case 2:
    local_18 = "Connection to the X Server failed: Extension not supported";
    break;
  case 3:
    local_18 = "Connection to the X server failed: Lack of memory";
    break;
  case 4:
    local_18 = "Connection to the X server failed: Invalid request";
    break;
  case 5:
    local_18 = "Connection to the X server failed: Invalid display";
    break;
  case 6:
    local_18 = "Connection to the X server failed: Screen not found";
    break;
  default:
    local_18 = "Connection to the X server failed";
  }
  internal_logger(natwm_logger,LEVEL_CRITICAL,local_18);
  return;
}

Assistant:

static void handle_connection_error(int error)
{
        const char *message = NULL;

        switch (error) {
        case XCB_CONN_CLOSED_EXT_NOTSUPPORTED:
                message = "Connection to the X Server failed: Extension not "
                          "supported";
                break;
        case XCB_CONN_CLOSED_MEM_INSUFFICIENT:
                message = "Connection to the X server failed: Lack of memory";
                break;
        case XCB_CONN_CLOSED_REQ_LEN_EXCEED:
                message = "Connection to the X server failed: Invalid request";
                break;
        case XCB_CONN_CLOSED_PARSE_ERR:
                message = "Connection to the X server failed: Invalid display";
                break;
        case XCB_CONN_CLOSED_INVALID_SCREEN:
                message = "Connection to the X server failed: Screen not found";
                break;
        default:
                message = "Connection to the X server failed";
        }

        LOG_CRITICAL(natwm_logger, message);
}